

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-uname.c
# Opt level: O0

int run_test_uname(void)

{
  int iVar1;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_596 [2];
  int r;
  uv_utsname_t buffer;
  utsname buf;
  
  iVar1 = uv_os_uname((uv_utsname_t *)0x0);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-uname.c"
            ,0x2a,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
    abort();
  }
  iVar1 = uv_os_uname((uv_utsname_t *)local_596);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-uname.c"
            ,0x2e,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uname((utsname *)(buffer.machine + 0xf8));
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-uname.c"
            ,0x31,"uname(&buf)","!=","-1",0xffffffffffffffff,"!=",0xffffffffffffffff);
    abort();
  }
  iVar1 = strcmp(local_596,buffer.machine + 0xf8);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-uname.c"
            ,0x32,"strcmp(buffer.sysname, buf.sysname)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = strcmp(buffer.release + 0xf8,buf.release + 0x39);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-uname.c"
            ,0x33,"strcmp(buffer.version, buf.version)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = strcmp(buffer.sysname + 0xf8,buf.nodename + 0x39);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-uname.c"
            ,0x39,"strcmp(buffer.release, buf.release)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = strcmp(buffer.version + 0xf8,buf.version + 0x39);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-uname.c"
            ,0x3f,"strcmp(buffer.machine, buf.machine)","==","0",(long)iVar1,"==",0);
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(uname) {
#ifndef _WIN32
  struct utsname buf;
#endif
#ifdef _AIX
  char temp[256];
#endif
  uv_utsname_t buffer;
  int r;

  /* Verify that NULL is handled properly. */
  r = uv_os_uname(NULL);
  ASSERT_EQ(r, UV_EINVAL);

  /* Verify the happy path. */
  r = uv_os_uname(&buffer);
  ASSERT_OK(r);

#ifndef _WIN32
  ASSERT_NE(uname(&buf), -1);
  ASSERT_OK(strcmp(buffer.sysname, buf.sysname));
  ASSERT_OK(strcmp(buffer.version, buf.version));

# ifdef _AIX
  snprintf(temp, sizeof(temp), "%s.%s", buf.version, buf.release);
  ASSERT_OK(strcmp(buffer.release, temp));
# else
  ASSERT_OK(strcmp(buffer.release, buf.release));
# endif /* _AIX */

# if defined(_AIX) || defined(__PASE__)
  ASSERT_OK(strcmp(buffer.machine, "ppc64"));
# else
  ASSERT_OK(strcmp(buffer.machine, buf.machine));
# endif /* defined(_AIX) || defined(__PASE__) */

#endif /* _WIN32 */

  return 0;
}